

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void write_vector_int<QPDF::HPageOffsetEntry,long_long>
               (BitWriter *w,int nitems,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec,int bits
               ,offset_in_HPageOffsetEntry_to_long_long field)

{
  pointer pHVar1;
  ulong uVar2;
  unsigned_long_long val;
  type ii;
  ulong uVar3;
  type ii_1;
  
  uVar3 = 0;
  while( true ) {
    if (nitems < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems);
    }
    if ((long)nitems == uVar3) break;
    pHVar1 = (vec->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(vec->
                   super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
    }
    val = *(unsigned_long_long *)((long)&pHVar1->delta_nobjects + field);
    if ((long)val < 0) {
      QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
      val = *(unsigned_long_long *)((long)&pHVar1->delta_nobjects + field);
    }
    if (bits < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(bits);
    }
    BitWriter::writeBits(w,val,(long)bits);
    uVar3 = uVar3 + 1;
    field = field + 0x58;
  }
  BitWriter::flush(w);
  return;
}

Assistant:

static void
write_vector_int(BitWriter& w, int nitems, std::vector<T>& vec, int bits, int_type T::* field)
{
    // nitems times, write bits bits from the given field of the ith vector to the given bit writer.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        w.writeBits(QIntC::to_ulonglong(vec.at(i).*field), QIntC::to_size(bits));
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    w.flush();
}